

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

void __thiscall CNetAddr::CNetAddr(CNetAddr *this,in_addr *ipv4Addr)

{
  long in_FS_OFFSET;
  uchar local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = '\0';
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector(&this->m_addr,0x10,&local_19);
  this->m_net = NET_IPV4;
  this->m_scope_id = 0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::assign<const_unsigned_char_*>
            (&this->m_addr,(uchar *)ipv4Addr,(uchar *)(ipv4Addr + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CNetAddr::CNetAddr(const struct in_addr& ipv4Addr)
{
    m_net = NET_IPV4;
    const uint8_t* ptr = reinterpret_cast<const uint8_t*>(&ipv4Addr);
    m_addr.assign(ptr, ptr + ADDR_IPV4_SIZE);
}